

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall
Lodtalk::AST::IdentifierExpression::IdentifierExpression
          (IdentifierExpression *this,string *identifier)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__IdentifierExpression_0016fe48;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  (this->variable).super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->variable).super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

IdentifierExpression::IdentifierExpression(const std::string &identifier)
	: identifier(identifier)
{
}